

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O3

void __thiscall FZipLump::SetLumpAddress(FZipLump *this)

{
  BYTE *pBVar1;
  FileReader *pFVar2;
  FZipLocalFileHeader localHeader;
  undefined1 local_36 [26];
  ushort local_1c;
  ushort local_1a;
  
  pFVar2 = ((this->super_FResourceLump).Owner)->Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(long)this->Position,0);
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,local_36,0x1e);
  this->Position = this->Position + (uint)local_1a + (uint)local_1c + 0x1e;
  pBVar1 = &(this->super_FResourceLump).Flags;
  *pBVar1 = *pBVar1 & 0x7f;
  return;
}

Assistant:

void FZipLump::SetLumpAddress()
{
	// This file is inside a zip and has not been opened before.
	// Position points to the start of the local file header, which we must
	// read and skip so that we can get to the actual file data.
	FZipLocalFileHeader localHeader;
	int skiplen;

	FileReader *file = Owner->Reader;

	file->Seek(Position, SEEK_SET);
	file->Read(&localHeader, sizeof(localHeader));
	skiplen = LittleShort(localHeader.NameLength) + LittleShort(localHeader.ExtraLength);
	Position += sizeof(localHeader) + skiplen;
	Flags &= ~LUMPFZIP_NEEDFILESTART;
}